

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

size_t phosg::count_zeroes(void *vdata,size_t size,size_t stride)

{
  undefined8 local_38;
  size_t z;
  size_t zero_count;
  uint8_t *data;
  size_t stride_local;
  size_t size_local;
  void *vdata_local;
  
  z = 0;
  for (local_38 = 0; local_38 < size; local_38 = stride + local_38) {
    if (*(char *)((long)vdata + local_38) == '\0') {
      z = z + 1;
    }
  }
  return z;
}

Assistant:

size_t count_zeroes(const void* vdata, size_t size, size_t stride) {
  const uint8_t* data = reinterpret_cast<const uint8_t*>(vdata);
  size_t zero_count = 0;
  for (size_t z = 0; z < size; z += stride) {
    if (data[z] == 0) {
      zero_count++;
    }
  }
  return zero_count;
}